

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdAuto.c
# Opt level: O2

char * Cmd_DeriveConvertIntoString(int argc,char **argv)

{
  size_t sVar1;
  char *__dest;
  ulong uVar2;
  ulong uVar3;
  char pBuffer [1000];
  char acStack_408 [1000];
  
  uVar2 = 0;
  memset(acStack_408,0,1000);
  uVar3 = (ulong)(uint)argc;
  if (argc < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    strcat(acStack_408,argv[uVar2]);
    sVar1 = strlen(acStack_408);
    (acStack_408 + sVar1)[0] = ' ';
    (acStack_408 + sVar1)[1] = '\0';
  }
  sVar1 = strlen(acStack_408);
  __dest = (char *)malloc(sVar1 + 1);
  strcpy(__dest,acStack_408);
  return __dest;
}

Assistant:

char * Cmd_DeriveConvertIntoString( int argc, char ** argv )
{
    char pBuffer[CMD_AUTO_LINE_MAX] = {0};
    int i;
    for ( i = 0; i < argc; i++ )
    {
        strcat( pBuffer, argv[i] );
        strcat( pBuffer, " " );
    }
    return Abc_UtilStrsav(pBuffer);
}